

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-info.c
# Opt level: O2

my_rational sum_criticals(critical_level *head)

{
  uint denominator;
  my_rational level_added_dice;
  my_rational added_dice;
  my_rational pr_not_this;
  my_rational remaining_chance;
  
  remaining_chance = my_rational_construct(1,1);
  added_dice = my_rational_construct(0,1);
  while (head != (critical_level *)0x0) {
    denominator = 1;
    if (head->next != (critical_level *)0x0) {
      denominator = head->chance;
    }
    level_added_dice = my_rational_construct(head->added_dice,denominator);
    level_added_dice = my_rational_product(&level_added_dice,&remaining_chance);
    added_dice = my_rational_sum(&added_dice,&level_added_dice);
    if (head->next == (critical_level *)0x0) {
      head = (critical_level *)0x0;
    }
    else {
      pr_not_this = my_rational_construct(head->chance - 1,head->chance);
      remaining_chance = my_rational_product(&remaining_chance,&pr_not_this);
      head = head->next;
    }
  }
  return added_dice;
}

Assistant:

static struct my_rational sum_criticals(const struct critical_level *head)
{
	struct my_rational remaining_chance = my_rational_construct(1, 1);
	struct my_rational added_dice = my_rational_construct(0, 1);

	while (head) {
		/* The last level of criticals takes all the remainder. */
		struct my_rational level_added_dice = my_rational_construct(
			head->added_dice, (head->next) ? head->chance : 1);

		level_added_dice = my_rational_product(&level_added_dice,
			&remaining_chance);
		added_dice = my_rational_sum(&added_dice, &level_added_dice);
		if (head->next) {
			struct my_rational pr_not_this = my_rational_construct(
				head->chance - 1, head->chance);

			remaining_chance = my_rational_product(
				&remaining_chance, &pr_not_this);
		}
		head = head->next;
	}

	return added_dice;
}